

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O0

int bhito(obj *obj,obj *otmp)

{
  boolean bVar1;
  obj *poVar2;
  char *pcVar3;
  monst *pmVar4;
  obj *local_30;
  obj *o;
  int res;
  obj *otmp_local;
  obj *obj_local;
  
  o._4_4_ = 1;
  if ((*(uint *)&obj->field_0x4a >> 0x1a & 1) != 0) {
    if (flags.bypasses != '\0') {
      return 0;
    }
    *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xfbffffff;
  }
  if ((obj->where != '\x01') && (otmp->otyp != 0x1a4)) {
    warning("bhito: obj is not floor or Stone To Flesh spell");
  }
  if (obj == uball) {
    o._4_4_ = 0;
  }
  else if (obj == uchain) {
    if ((otmp->otyp == 0x1cc) || (otmp->otyp == 0x186)) {
      unpunish();
      discover_object((int)otmp->otyp,'\x01','\x01');
    }
    else {
      o._4_4_ = 0;
    }
  }
  else {
    switch(otmp->otyp) {
    case 0x185:
    case 0x18b:
    case 0x196:
    case 0x1c3:
    case 0x1c6:
    case 0x1c7:
      o._4_4_ = 0;
      break;
    case 0x186:
    case 0x18c:
    case 0x1cc:
    case 0x1cd:
      if (((obj->otyp == 0xda) || (obj->otyp == 0xdb)) || (obj->otyp == 0xdc)) {
        bVar1 = boxlock(obj,otmp);
        o._4_4_ = (uint)bVar1;
      }
      else {
        o._4_4_ = 0;
      }
      if (o._4_4_ != 0) {
        discover_object((int)otmp->otyp,'\x01','\x01');
      }
      break;
    case 0x187:
    case 0x1c4:
      if (obj->otyp == 0x214) {
        fracture_rock(obj);
      }
      else if (obj->otyp == 0x215) {
        break_statue(obj);
      }
      else {
        if (flags.mon_moving == '\0') {
          hero_breaks(obj,obj->ox,obj->oy,'\0');
        }
        else {
          breaks(obj,obj->ox,obj->oy);
        }
        o._4_4_ = 0;
      }
      discover_object((int)otmp->otyp,'\x01','\x01');
      break;
    default:
      warning("What an interesting effect (%d)",(ulong)(uint)(int)otmp->otyp);
      break;
    case 0x18a:
      drain_item(obj);
      break;
    case 0x19d:
    case 0x1c8:
      if (obj->otyp == 0x10f) {
        revive_egg(obj);
      }
      else {
        pmVar4 = revive(obj);
        o._4_4_ = (uint)(pmVar4 != (monst *)0x0);
      }
      break;
    case 0x19e:
    case 0x1c9:
      if (((obj->otyp == 0x1c9) || (obj->otyp == 0x19e)) ||
         ((obj->otyp == 0x13a ||
          ((obj->otyp == 0xcf || (bVar1 = obj_resists(obj,5,0x5f), bVar1 != '\0')))))) {
        o._4_4_ = 0;
      }
      else {
        u.uconduct.polypiles = u.uconduct.polypiles + 1;
        if (((obj->otyp == 0xda) || (obj->otyp == 0xdb)) || (obj->otyp == 0xdc)) {
          boxlock(obj,otmp);
        }
        bVar1 = obj_shudders(obj);
        if (bVar1 == '\0') {
          poVar2 = poly_obj(obj,0);
          if ((poVar2->where == '\x01') && (poVar2->otyp == 0x214)) {
            block_point((int)poVar2->ox,(int)poVar2->oy);
          }
          newsym((int)poVar2->ox,(int)poVar2->oy);
        }
        else {
          if ((viz_array[obj->oy][obj->ox] & 2U) != 0) {
            discover_object((int)otmp->otyp,'\x01','\x01');
          }
          do_osshock(obj);
        }
      }
      break;
    case 0x19f:
    case 0x1cb:
      rloco(obj);
      break;
    case 0x1a1:
    case 0x1ca:
      cancel_item(obj);
      newsym((int)obj->ox,(int)obj->oy);
      break;
    case 0x1a4:
      o._4_4_ = hito_stone_to_flesh(obj);
      break;
    case 0x1c5:
      break;
    case 0x1ce:
      o._4_4_ = (uint)(((*(uint *)&obj->field_0x4a >> 5 & 1) != 0 ^ 0xffU) & 1);
      *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xffffffdf | 0x20;
      if (((0xd9 < obj->otyp) && (obj->otyp < 0xe2)) || (obj->otyp == 0x215)) {
        if (obj->cobj == (obj *)0x0) {
          pcVar3 = Tobjnam(obj,"are");
          pline("%s empty.",pcVar3);
        }
        else {
          for (local_30 = obj->cobj; local_30 != (obj *)0x0; local_30 = local_30->nobj) {
            *(uint *)&local_30->field_0x4a = *(uint *)&local_30->field_0x4a & 0xffffffdf | 0x20;
          }
          display_cinventory(obj);
        }
        o._4_4_ = 1;
      }
      if (o._4_4_ != 0) {
        discover_object(0x1ce,'\x01','\x01');
      }
    }
  }
  return o._4_4_;
}

Assistant:

int bhito(struct obj *obj, struct obj *otmp)
{
	int res = 1;	/* affected object by default */

	if (obj->bypass) {
		/* The bypass bit is currently only used as follows:
		 *
		 * POLYMORPH - When a monster being polymorphed drops something
		 *             from its inventory as a result of the change.
		 *             If the items fall to the floor, they are not
		 *             subject to direct subsequent polymorphing
		 *             themselves on that same zap. This makes it
		 *             consistent with items that remain in the
		 *             monster's inventory. They are not polymorphed
		 *             either.
		 * UNDEAD_TURNING - When an undead creature gets killed via
		 *	       undead turning, prevent its corpse from being
		 *	       immediately revived by the same effect.
		 *
		 * The bypass bit on all objects is reset each turn, whenever
		 * flags.bypasses is set.
		 *
		 * We check the obj->bypass bit above AND flags.bypasses
		 * as a safeguard against any stray occurrence left in an obj
		 * struct someplace, although that should never happen.
		 */
		if (flags.bypasses)
			return 0;
		else
			obj->bypass = 0;
	}

	/*
	 * Some parts of this function expect the object to be on the floor
	 * obj->{ox,oy} to be valid.  The exception to this (so far) is
	 * for the STONE_TO_FLESH spell.
	 */
	if (!(obj->where == OBJ_FLOOR || otmp->otyp == SPE_STONE_TO_FLESH))
	    warning("bhito: obj is not floor or Stone To Flesh spell");

	if (obj == uball) {
		res = 0;
	} else if (obj == uchain) {
		if (otmp->otyp == WAN_OPENING || otmp->otyp == SPE_KNOCK) {
		    unpunish();
		    makeknown(otmp->otyp);
		} else
		    res = 0;
	} else
	switch(otmp->otyp) {
	case WAN_POLYMORPH:
	case SPE_POLYMORPH:
		if (obj->otyp == WAN_POLYMORPH ||
			obj->otyp == SPE_POLYMORPH ||
			obj->otyp == POT_POLYMORPH ||
			obj->otyp == AMULET_OF_UNCHANGING ||
			obj_resists(obj, 5, 95)) {
		    res = 0;
		    break;
		}
		/* KMH, conduct */
		u.uconduct.polypiles++;
		/* any saved lock context will be dangerously obsolete */
		if (Is_box(obj)) boxlock(obj, otmp);

		if (obj_shudders(obj)) {
		    if (cansee(obj->ox, obj->oy))
			makeknown(otmp->otyp);
		    do_osshock(obj);
		    break;
		}
		obj = poly_obj(obj, STRANGE_OBJECT);
		/* poly_obj doesn't block vision, do that ourselves now. */
		if (obj->where == OBJ_FLOOR && obj->otyp == BOULDER)
		    block_point(obj->ox, obj->oy);
		newsym(obj->ox,obj->oy);
		break;
	case WAN_PROBING:
		res = !obj->dknown;
		/* target object has now been "seen (up close)" */
		obj->dknown = 1;
		if (Is_container(obj) || obj->otyp == STATUE) {
		    if (!obj->cobj)
			pline("%s empty.", Tobjnam(obj, "are"));
		    else {
			struct obj *o;
			/* view contents (not recursively) */
			for (o = obj->cobj; o; o = o->nobj)
			    o->dknown = 1;	/* "seen", even if blind */
			display_cinventory(obj);
		    }
		    res = 1;
		}
		if (res) makeknown(WAN_PROBING);
		break;
	case WAN_STRIKING:
	case SPE_FORCE_BOLT:
		if (obj->otyp == BOULDER)
			fracture_rock(obj);
		else if (obj->otyp == STATUE)
			break_statue(obj);
		else {
			if (!flags.mon_moving)
			    hero_breaks(obj, obj->ox, obj->oy, FALSE);
			else
			    breaks(obj, obj->ox, obj->oy);
			res = 0;
		}
		/* BUG[?]: shouldn't this depend upon you seeing it happen? */
		makeknown(otmp->otyp);
		break;
	case WAN_CANCELLATION:
	case SPE_CANCELLATION:
		cancel_item(obj);
		newsym(obj->ox,obj->oy);	/* might change color */
		break;
	case SPE_DRAIN_LIFE:
		drain_item(obj);
		break;
	case WAN_TELEPORTATION:
	case SPE_TELEPORT_AWAY:
		rloco(obj);
		break;
	case WAN_MAKE_INVISIBLE:
#ifdef INVISIBLE_OBJECTS
		obj->oinvis = TRUE;
		newsym(obj->ox,obj->oy);	/* make object disappear */
#endif
		break;
	case WAN_UNDEAD_TURNING:
	case SPE_TURN_UNDEAD:
		if (obj->otyp == EGG)
			revive_egg(obj);
		else
			res = !!revive(obj);
		break;
	case WAN_OPENING:
	case SPE_KNOCK:
	case WAN_LOCKING:
	case SPE_WIZARD_LOCK:
		if (Is_box(obj))
			res = boxlock(obj, otmp);
		else
			res = 0;
		if (res /* && otmp->oclass == WAND_CLASS */)
			makeknown(otmp->otyp);
		break;
	case WAN_SLOW_MONSTER:		/* no effect on objects */
	case SPE_SLOW_MONSTER:
	case WAN_SPEED_MONSTER:
	case WAN_NOTHING:
	case SPE_HEALING:
	case SPE_EXTRA_HEALING:
		res = 0;
		break;
	case SPE_STONE_TO_FLESH:
		res = hito_stone_to_flesh(obj);
		break;
	default:
		warning("What an interesting effect (%d)", otmp->otyp);
		break;
	}
	return res;
}